

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libfsst.hpp
# Opt level: O3

void __thiscall SymbolTable::finalize(SymbolTable *this,u8 zeroTerminated)

{
  u64 uVar1;
  ulong uVar2;
  u32 i;
  long lVar3;
  ulong uVar4;
  byte bVar5;
  ushort uVar6;
  u32 k;
  uint uVar7;
  ulong uVar8;
  u64 *puVar9;
  int iVar10;
  ulong uVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  byte local_161;
  byte local_160;
  u8 local_15f;
  byte local_15e [6];
  ulong local_158;
  ulong local_150;
  ulong local_148;
  u64 *local_140;
  byte local_138 [192];
  u8 rsum [8];
  
  uVar6 = this->nSymbols;
  local_150 = (ulong)uVar6;
  local_160 = ((char)uVar6 + zeroTerminated) - (char)this->lenHisto[0];
  local_15f = zeroTerminated;
  lVar3 = 0;
  bVar5 = zeroTerminated;
  do {
    bVar5 = bVar5 + (char)this->lenHisto[lVar3 + 1];
    local_15e[lVar3] = bVar5;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 6);
  uVar11 = (ulong)zeroTerminated;
  this->suffixLim = (ushort)zeroTerminated;
  local_138[0] = 0;
  uVar1 = this->symbols[0x100].icl;
  this->symbols[0].val = this->symbols[0x100].val;
  this->symbols[0].icl = uVar1;
  local_158 = uVar11;
  if (zeroTerminated <= uVar6 && uVar6 != zeroTerminated) {
    local_161 = local_15e[0];
    local_140 = &this->symbols[0x100].icl;
    uVar4 = 0xffffffff0000000;
    local_148 = 0xffffffff0000000;
    do {
      uVar1 = this->symbols[uVar11 + 0x100].val.num;
      uVar2 = this->symbols[uVar11 + 0x100].icl;
      iVar10 = (int)(uVar2 >> 0x1c);
      if ((uVar2 & uVar4) == 0x20000000) {
        uVar8 = 0;
        uVar4 = local_150;
        puVar9 = local_140;
        do {
          bVar12 = uVar11 == uVar8;
          bVar13 = (*puVar9 & 0xfffffffe0000000) == 0;
          bVar14 = (short)uVar1 != (short)(((Symbol *)(puVar9 + -1))->val).num;
          uVar4 = uVar4 & 0xffffffff;
          if ((!bVar14 && !bVar12) && !bVar13) {
            uVar4 = 0;
          }
          uVar8 = uVar8 + 1;
          puVar9 = puVar9 + 2;
        } while (uVar8 < uVar4);
        uVar4 = local_148;
        if ((bVar14 || bVar12) || bVar13) {
          bVar5 = (byte)local_158;
          uVar7 = (int)local_158 + 1;
          this->suffixLim = (u16)uVar7;
          local_158 = (ulong)uVar7;
        }
        else {
          bVar5 = local_161 - 1;
          local_161 = bVar5;
        }
      }
      else {
        uVar7 = iVar10 - 1;
        bVar5 = (&local_160)[uVar7];
        (&local_160)[uVar7] = bVar5 + 1;
      }
      local_138[uVar11] = bVar5;
      this->symbols[bVar5].val.num = uVar1;
      this->symbols[bVar5].icl =
           (ulong)(iVar10 * -8 + 0x40U | (uint)bVar5 << 0x10 | (uint)uVar2 & 0xf0000000);
      uVar11 = uVar11 + 1;
    } while (uVar11 != uVar6);
  }
  lVar3 = 0;
  do {
    uVar6 = 0x11ff;
    if ((this->byteCodes[lVar3] >> 8 & 1) != 0) {
      uVar6 = local_138[(ulong)this->byteCodes[lVar3] & 0xff] | 0x1000;
    }
    this->byteCodes[lVar3] = uVar6;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x100);
  uVar11 = 0;
  do {
    uVar6 = this->shortCodes[uVar11];
    if ((uVar6 >> 8 & 1) == 0) {
      uVar6 = this->byteCodes[uVar11 & 0xff];
    }
    else {
      uVar6 = uVar6 & 0xf000 | (ushort)local_138[(byte)uVar6];
    }
    this->shortCodes[uVar11] = uVar6;
    uVar11 = uVar11 + 1;
  } while (uVar11 != 0x10000);
  lVar3 = 0;
  do {
    uVar11 = *(ulong *)((long)&this->hashTab[0].icl + lVar3);
    if (uVar11 < 0xf1ff0000) {
      puVar9 = (u64 *)((long)&this->hashTab[0].icl + lVar3);
      uVar1 = this->symbols[local_138[uVar11 >> 0x10 & 0xff]].icl;
      *(anon_union_8_2_43acef4c_for_val *)(puVar9 + -1) =
           this->symbols[local_138[uVar11 >> 0x10 & 0xff]].val;
      *puVar9 = uVar1;
    }
    lVar3 = lVar3 + 0x10;
  } while (lVar3 != 0x4000);
  return;
}

Assistant:

void finalize(u8 zeroTerminated) {
       assert(nSymbols <= 255);
       u8 newCode[256], rsum[8], byteLim = nSymbols - (lenHisto[0] - zeroTerminated);

       // compute running sum of code lengths (starting offsets for each length) 
       rsum[0] = byteLim; // 1-byte codes are highest
       rsum[1] = zeroTerminated;
       for(u32 i=1; i<7; i++)
          rsum[i+1] = rsum[i] + lenHisto[i];

       // determine the new code for each symbol, ordered by length (and splitting 2byte symbols into two classes around suffixLim)
       suffixLim = rsum[1];
       symbols[newCode[0] = 0] = symbols[256]; // keep symbol 0 in place (for zeroTerminated cases only)

       for(u32 i=zeroTerminated, j=rsum[2]; i<nSymbols; i++) {  
          Symbol s1 = symbols[FSST_CODE_BASE+i];
          u32 len = s1.length(), opt = (len == 2)*nSymbols;
          if (opt) {
              u16 first2 = s1.first2();
              for(u32 k=0; k<opt; k++) {  
                 Symbol s2 = symbols[FSST_CODE_BASE+k];
                 if (k != i && s2.length() > 1 && first2 == s2.first2()) // test if symbol k is a suffix of s
                    opt = 0;
              }
              newCode[i] = opt?suffixLim++:--j; // symbols without a larger suffix have a code < suffixLim 
          } else 
              newCode[i] = rsum[len-1]++;
          s1.set_code_len(newCode[i],len);
          symbols[newCode[i]] = s1; 
       }
       // renumber the codes in byteCodes[] 
       for(u32 i=0; i<256; i++) 
          if ((byteCodes[i] & FSST_CODE_MASK) >= FSST_CODE_BASE)
             byteCodes[i] = newCode[(u8) byteCodes[i]] + (1 << FSST_LEN_BITS);
          else 
             byteCodes[i] = 511 + (1 << FSST_LEN_BITS);
       
       // renumber the codes in shortCodes[] 
       for(u32 i=0; i<65536; i++)
          if ((shortCodes[i] & FSST_CODE_MASK) >= FSST_CODE_BASE)
             shortCodes[i] = newCode[(u8) shortCodes[i]] + (shortCodes[i] & (15 << FSST_LEN_BITS));
          else 
             shortCodes[i] = byteCodes[i&0xFF];

       // replace the symbols in the hash table
       for(u32 i=0; i<hashTabSize; i++)
          if (hashTab[i].icl < FSST_ICL_FREE)
             hashTab[i] = symbols[newCode[(u8) hashTab[i].code()]];
   }